

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanobenchmark.cc
# Opt level: O0

Duration highwayhash::anon_unknown_0::EstimateResolutionOnCurrentCPU(Func func,uint8_t *arg)

{
  uint32_t uVar1;
  uint uVar2;
  Duration resolution;
  Duration t1;
  uint32_t local_834;
  ulong uStack_830;
  Duration t0;
  size_t i;
  Duration samples [512];
  size_t kNumSamples;
  uint8_t *arg_local;
  Func func_local;
  
  for (uStack_830 = 0; uStack_830 < 0x200; uStack_830 = uStack_830 + 1) {
    local_834 = Start<unsigned_int>();
    _resolution = (*func)(arg,uStack_830);
    PreventElision<unsigned_long>((unsigned_long *)&resolution);
    uVar1 = Stop<unsigned_int>();
    samples[uStack_830 - 2] = uVar1 - local_834;
  }
  CountingSort<unsigned_int>((uint *)&i,samples + 0x1fe);
  uVar2 = Mode<unsigned_int>((uint *)&i,0x200);
  return uVar2;
}

Assistant:

Duration EstimateResolutionOnCurrentCPU(const Func func, const uint8_t* arg) {
  // Even 128K samples are not enough to achieve repeatable results when
  // throttling is enabled; the caller must perform additional aggregation.
  const size_t kNumSamples = 512;
  Duration samples[kNumSamples];
  for (size_t i = 0; i < kNumSamples; ++i) {
    const volatile Duration t0 = Start<Duration>();
    PreventElision(func(arg, i));
    const volatile Duration t1 = Stop<Duration>();
    NANOBENCHMARK_CHECK(t0 <= t1);
    samples[i] = t1 - t0;
  }
  CountingSort(samples, samples + kNumSamples);
  const Duration resolution = Mode(samples, kNumSamples);
  NANOBENCHMARK_CHECK(resolution != 0);
  return resolution;
}